

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

lzma_ret lzma_lzma_encoder_create
                   (void **coder_ptr,lzma_allocator *allocator,lzma_options_lzma *options,
                   lzma_lz_options_conflict *lz_options)

{
  lzma_lzma1_encoder *coder_00;
  lzma_ret lVar1;
  void *pvVar2;
  _Bool local_41;
  int local_3c;
  uint32_t log_size;
  lzma_lzma1_encoder *coder;
  lzma_lz_options_conflict *lz_options_local;
  lzma_options_lzma *options_local;
  lzma_allocator *allocator_local;
  void **coder_ptr_local;
  
  if (*coder_ptr == (void *)0x0) {
    pvVar2 = lzma_alloc(0x3cee8,allocator);
    *coder_ptr = pvVar2;
    if (*coder_ptr == (void *)0x0) {
      return LZMA_MEM_ERROR;
    }
  }
  coder_00 = (lzma_lzma1_encoder *)*coder_ptr;
  if (options->mode == LZMA_MODE_FAST) {
    coder_00->fast_mode = true;
  }
  else {
    if (options->mode != LZMA_MODE_NORMAL) {
      return LZMA_OPTIONS_ERROR;
    }
    coder_00->fast_mode = false;
    for (local_3c = 0; (uint)(1 << ((byte)local_3c & 0x1f)) < options->dict_size;
        local_3c = local_3c + 1) {
    }
    coder_00->dist_table_size = local_3c << 1;
    (coder_00->match_len_encoder).table_size = options->nice_len - 1;
    (coder_00->rep_len_encoder).table_size = options->nice_len - 1;
  }
  local_41 = false;
  if (options->preset_dict != (uint8_t *)0x0) {
    local_41 = options->preset_dict_size != 0;
  }
  coder_00->is_initialized = local_41;
  coder_00->is_flushed = false;
  set_lz_options(lz_options,options);
  lVar1 = lzma_lzma_encoder_reset(coder_00,options);
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_create(void **coder_ptr,
		const lzma_allocator *allocator,
		const lzma_options_lzma *options, lzma_lz_options *lz_options)
{
	// Allocate lzma_lzma1_encoder if it wasn't already allocated.
	if (*coder_ptr == NULL) {
		*coder_ptr = lzma_alloc(sizeof(lzma_lzma1_encoder), allocator);
		if (*coder_ptr == NULL)
			return LZMA_MEM_ERROR;
	}

	lzma_lzma1_encoder *coder = *coder_ptr;

	// Set compression mode. We haven't validates the options yet,
	// but it's OK here, since nothing bad happens with invalid
	// options in the code below, and they will get rejected by
	// lzma_lzma_encoder_reset() call at the end of this function.
	switch (options->mode) {
		case LZMA_MODE_FAST:
			coder->fast_mode = true;
			break;

		case LZMA_MODE_NORMAL: {
			coder->fast_mode = false;

			// Set dist_table_size.
			// Round the dictionary size up to next 2^n.
			uint32_t log_size = 0;
			while ((UINT32_C(1) << log_size) < options->dict_size)
				++log_size;

			coder->dist_table_size = log_size * 2;

			// Length encoders' price table size
			coder->match_len_encoder.table_size
				= options->nice_len + 1 - MATCH_LEN_MIN;
			coder->rep_len_encoder.table_size
				= options->nice_len + 1 - MATCH_LEN_MIN;
			break;
		}

		default:
			return LZMA_OPTIONS_ERROR;
	}

	// We don't need to write the first byte as literal if there is
	// a non-empty preset dictionary. encode_init() wouldn't even work
	// if there is a non-empty preset dictionary, because encode_init()
	// assumes that position is zero and previous byte is also zero.
	coder->is_initialized = options->preset_dict != NULL
			&& options->preset_dict_size > 0;
	coder->is_flushed = false;

	set_lz_options(lz_options, options);

	return lzma_lzma_encoder_reset(coder, options);
}